

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRShared.cpp
# Opt level: O0

void __thiscall Assimp::IrrlichtBase::ReadIntProperty(IrrlichtBase *this,IntProperty *out)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  allocator<char> local_41;
  string local_40 [36];
  uint local_1c;
  IntProperty *pIStack_18;
  int i;
  IntProperty *out_local;
  IrrlichtBase *this_local;
  
  pIStack_18 = out;
  out_local = (IntProperty *)this;
  for (local_1c = 0; uVar1 = local_1c, iVar2 = (*this->reader->_vptr_IIrrXMLReader[4])(),
      (int)uVar1 < iVar2; local_1c = local_1c + 1) {
    iVar2 = (*this->reader->_vptr_IIrrXMLReader[5])(this->reader,(ulong)local_1c);
    iVar2 = ASSIMP_stricmp((char *)CONCAT44(extraout_var,iVar2),"name");
    if (iVar2 == 0) {
      iVar2 = (*this->reader->_vptr_IIrrXMLReader[6])(this->reader,(ulong)local_1c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_40,(char *)CONCAT44(extraout_var_00,iVar2),&local_41);
      std::__cxx11::string::operator=((string *)pIStack_18,local_40);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator(&local_41);
    }
    else {
      iVar2 = (*this->reader->_vptr_IIrrXMLReader[5])(this->reader,(ulong)local_1c);
      iVar2 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_01,iVar2),"value");
      if (iVar2 == 0) {
        iVar2 = (*this->reader->_vptr_IIrrXMLReader[6])(this->reader,(ulong)local_1c);
        iVar2 = strtol10((char *)CONCAT44(extraout_var_02,iVar2),(char **)0x0);
        pIStack_18->value = iVar2;
      }
    }
  }
  return;
}

Assistant:

void IrrlichtBase::ReadIntProperty    (IntProperty&    out)
{
    for (int i = 0; i < reader->getAttributeCount();++i)
    {
        if (!ASSIMP_stricmp(reader->getAttributeName(i),"name"))
        {
            out.name = std::string( reader->getAttributeValue(i) );
        }
        else if (!ASSIMP_stricmp(reader->getAttributeName(i),"value"))
        {
            // parse the ecimal value
            out.value = strtol10(reader->getAttributeValue(i));
        }
    }
}